

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall soplex::SoPlexBase<double>::_enableSimplifierAndScaler(SoPlexBase<double> *this)

{
  SPxScaler<double> *pSVar1;
  
  switch(this->_currentSettings->_intParamValues[10]) {
  case 0:
    this->_simplifier = (SPxSimplifier<double> *)0x0;
    break;
  case 1:
  case 2:
  case 3:
    this->_simplifier = &(this->_simplifierMainSM).super_SPxSimplifier<double>;
    (*(this->_simplifierMainSM).super_SPxSimplifier<double>._vptr_SPxSimplifier[0x12])
              (this->_currentSettings->_realParamValues[0x12]);
  }
  switch(this->_currentSettings->_intParamValues[0xb]) {
  case 0:
    pSVar1 = (SPxScaler<double> *)0x0;
    break;
  case 1:
    pSVar1 = &(this->_scalerUniequi).super_SPxScaler<double>;
    break;
  case 2:
    pSVar1 = &(this->_scalerBiequi).super_SPxScaler<double>;
    break;
  case 3:
    pSVar1 = &(this->_scalerGeo1).super_SPxScaler<double>;
    break;
  case 4:
    pSVar1 = &(this->_scalerGeo8).super_SPxScaler<double>;
    break;
  case 5:
    pSVar1 = &(this->_scalerLeastsq).super_SPxScaler<double>;
    break;
  case 6:
    pSVar1 = &(this->_scalerGeoequi).super_SPxScaler<double>;
    break;
  default:
    goto switchD_003193fe_default;
  }
  this->_scaler = pSVar1;
switchD_003193fe_default:
  return;
}

Assistant:

void SoPlexBase<R>::_enableSimplifierAndScaler()
{
   // type of simplifier
   switch(intParam(SoPlexBase<R>::SIMPLIFIER))
   {
   case SIMPLIFIER_OFF:
      _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = nullptr;
#endif
      break;

   case SIMPLIFIER_AUTO:
   case SIMPLIFIER_INTERNAL:
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif
      break;

   case SIMPLIFIER_PAPILO:
#ifdef SOPLEX_WITH_PAPILO
      _simplifier = &_simplifierPaPILO;
      assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierPaPILO;
      assert(_boostedSimplifier != nullptr);
#endif
#else
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif // !SOPLEX_WITH_MPFR
#endif // SOPLEX_WITH_PAPILO
      break;

   default:
      break;
   }

   // type of scaler
   switch(intParam(SoPlexBase<R>::SCALER))
   {
   case SCALER_OFF:
      _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif
      break;

   case SCALER_UNIEQUI:
      _scaler = &_scalerUniequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerUniequi;
#endif
      break;

   case SCALER_BIEQUI:
      _scaler = &_scalerBiequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerBiequi;
#endif
      break;

   case SCALER_GEO1:
      _scaler = &_scalerGeo1;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo1;
#endif
      break;

   case SCALER_GEO8:
      _scaler = &_scalerGeo8;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo8;
#endif
      break;

   case SCALER_LEASTSQ:
      _scaler = &_scalerLeastsq;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerLeastsq;
#endif
      break;

   case SCALER_GEOEQUI:
      _scaler = &_scalerGeoequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeoequi;
#endif
      break;

   default:
      break;
   }
}